

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::StdPropertyExtract_DynamicType
               (SnapObject *snpObject,DynamicObject *dynObj,SlabAllocator *alloc)

{
  int iVar1;
  Type *pTVar2;
  uint *puVar3;
  ArrayObject **ppAVar4;
  ArrayObject *local_68;
  ArrayObject *local_60;
  ArrayObject *parray;
  Var *ppvStack_50;
  uint32 auxSlotCount;
  Var *auxSlots;
  Type *pTStack_40;
  uint32 inlineSlotCount;
  Type *inlineSlots;
  TTDVar *cpyBase;
  SnapHandler *sHandler;
  SnapType *sType;
  SlabAllocator *alloc_local;
  DynamicObject *dynObj_local;
  SnapObject *snpObject_local;
  
  sHandler = (SnapHandler *)snpObject->SnapType;
  sType = (SnapType *)alloc;
  alloc_local = (SlabAllocator *)dynObj;
  dynObj_local = (DynamicObject *)snpObject;
  iVar1 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])();
  *(int *)&dynObj_local[1].super_RecyclableObject.super_FinalizableObject.
           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = iVar1;
  if (*(int *)(*(long *)&sHandler->IsExtensibleFlag + 0x10) == 0) {
    *(undefined4 *)
     ((long)&dynObj_local[1].super_RecyclableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = 0;
    dynObj_local[1].super_RecyclableObject.type.ptr = (Type *)0x0;
  }
  else {
    cpyBase = *(TTDVar **)&sHandler->IsExtensibleFlag;
    *(undefined4 *)
     ((long)&dynObj_local[1].super_RecyclableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) =
         *(undefined4 *)(cpyBase + 2);
    pTVar2 = (Type *)SlabAllocatorBase<0>::SlabAllocateArray<void*>
                               ((SlabAllocatorBase<0> *)sType,
                                (ulong)*(uint *)((long)&dynObj_local[1].super_RecyclableObject.
                                                        super_FinalizableObject.
                                                        super_IRecyclerVisitedObject.
                                                        _vptr_IRecyclerVisitedObject + 4));
    dynObj_local[1].super_RecyclableObject.type.ptr = pTVar2;
    inlineSlots = (Type *)dynObj_local[1].super_RecyclableObject.type.ptr;
    if (*(int *)(cpyBase + 1) != 0) {
      pTStack_40 = Js::DynamicObject::GetInlineSlots_TTD((DynamicObject *)alloc_local);
      puVar3 = min<unsigned_int>((uint *)(cpyBase + 2),(uint *)(cpyBase + 1));
      auxSlots._4_4_ = *puVar3;
      js_memcpy_s(inlineSlots,(ulong)auxSlots._4_4_ << 3,pTStack_40,(ulong)auxSlots._4_4_ << 3);
    }
    if (*(uint *)(cpyBase + 1) < *(uint *)(cpyBase + 2)) {
      inlineSlots = inlineSlots + *(uint *)(cpyBase + 1);
      ppvStack_50 = Js::DynamicObject::GetAuxSlots_TTD((DynamicObject *)alloc_local);
      parray._4_4_ = *(int *)(cpyBase + 2) - *(int *)(cpyBase + 1);
      js_memcpy_s(inlineSlots,(ulong)parray._4_4_ << 3,ppvStack_50,(ulong)parray._4_4_ << 3);
    }
  }
  local_60 = Js::DynamicObject::GetObjectArray((DynamicObject *)alloc_local);
  if (local_60 == (ArrayObject *)0x0) {
    local_68 = (ArrayObject *)0x0;
  }
  else {
    ppAVar4 = Memory::PointerValue<Js::ArrayObject>(&local_60);
    local_68 = *ppAVar4;
  }
  dynObj_local[1].auxSlots.ptr = (WriteBarrierPtr<void> *)local_68;
  dynObj_local[1].field_1 = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
  return;
}

Assistant:

void StdPropertyExtract_DynamicType(SnapObject* snpObject, Js::DynamicObject* dynObj, SlabAllocator& alloc)
        {
            NSSnapType::SnapType* sType = snpObject->SnapType;

            snpObject->IsCrossSite = dynObj->IsCrossSiteObject();

#if ENABLE_OBJECT_SOURCE_TRACKING
            CopyDiagnosticOriginInformation(snpObject->DiagOriginInfo, dynObj->TTDDiagOriginInfo);
#endif

            if(sType->TypeHandlerInfo->MaxPropertyIndex == 0)
            {
                snpObject->VarArrayCount = 0;
                snpObject->VarArray = nullptr;
            }
            else
            {
                NSSnapType::SnapHandler* sHandler = sType->TypeHandlerInfo;

                static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

                snpObject->VarArrayCount = sHandler->MaxPropertyIndex;
                snpObject->VarArray = alloc.SlabAllocateArray<TTDVar>(snpObject->VarArrayCount);

                TTDVar* cpyBase = snpObject->VarArray;
                if(sHandler->InlineSlotCapacity != 0)
                {
                    Field(Js::Var) const* inlineSlots = dynObj->GetInlineSlots_TTD();

                    //copy all the properties (if they all fit into the inline slots) otherwise just copy all the inline slot values
                    uint32 inlineSlotCount = min(sHandler->MaxPropertyIndex, sHandler->InlineSlotCapacity);
                    js_memcpy_s(cpyBase, inlineSlotCount * sizeof(TTDVar), inlineSlots, inlineSlotCount * sizeof(Js::Var));
                }

                if(sHandler->MaxPropertyIndex > sHandler->InlineSlotCapacity)
                {
                    cpyBase = cpyBase + sHandler->InlineSlotCapacity;
                    Js::Var const* auxSlots = dynObj->GetAuxSlots_TTD();

                    //there are some values in aux slots (in addition to the inline slots) so copy them as well
                    uint32 auxSlotCount = (sHandler->MaxPropertyIndex - sHandler->InlineSlotCapacity);
                    js_memcpy_s(cpyBase, auxSlotCount * sizeof(TTDVar), auxSlots, auxSlotCount * sizeof(Js::Var));
                }
            }

            Js::ArrayObject* parray = dynObj->GetObjectArray();
            snpObject->OptIndexedObjectArray = (parray == nullptr) ? TTD_INVALID_PTR_ID : TTD_CONVERT_VAR_TO_PTR_ID(parray);

            snpObject->OptDependsOnInfo = nullptr;
            //AddtlSnapObjectInfo must be set later in type specific extract code
        }